

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib652.c
# Opt level: O2

int test(char *URL)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ushort uVar4;
  char cVar5;
  char *pcVar6;
  long lVar7;
  
  cVar5 = 'A';
  uVar4 = 0;
  lVar7 = 0;
  while( true ) {
    if (lVar7 == 17000) break;
    lVar2 = (ulong)(byte)(cVar5 + (char)(uVar4 / 0x1a) * -0x1a) * 0x101010101010101;
    *(long *)(buffer + lVar7) = lVar2;
    *(short *)(buffer + lVar7 + 8) = (short)lVar2;
    cVar5 = cVar5 + '\x01';
    uVar4 = uVar4 + 1;
    lVar7 = lVar7 + 10;
  }
  iVar1 = curl_global_init(3,cVar5,uVar4 % 0x1a);
  if (iVar1 != 0) {
    curl_mfprintf(_stderr,"curl_global_init() failed\n");
    return 0x7e;
  }
  lVar7 = curl_easy_init();
  if (lVar7 == 0) {
    pcVar6 = "curl_easy_init() failed\n";
LAB_00101372:
    lVar2 = 0;
    curl_mfprintf(_stderr,pcVar6);
    iVar1 = 0x7e;
  }
  else {
    lVar2 = curl_mime_init(lVar7);
    if (lVar2 == 0) {
      pcVar6 = "curl_mime_init() failed\n";
      goto LAB_00101372;
    }
    lVar3 = curl_mime_addpart(lVar2);
    if (lVar3 == 0) {
      lVar3 = 0;
      curl_mfprintf(_stderr,"curl_mime_addpart() failed\n");
      iVar1 = 0x7e;
      goto LAB_00101434;
    }
    iVar1 = curl_mime_filename(lVar3,"myfile.jpg");
    if (iVar1 != 0) {
      pcVar6 = "curl_mime_filename() failed\n";
LAB_0010142a:
      lVar3 = 0;
      curl_mfprintf(_stderr,pcVar6);
      goto LAB_00101434;
    }
    iVar1 = curl_mime_type(lVar3,"image/jpeg");
    if (iVar1 != 0) {
      pcVar6 = "curl_mime_type() failed\n";
      goto LAB_0010142a;
    }
    iVar1 = curl_mime_data(lVar3,buffer,17000);
    if (iVar1 != 0) {
      pcVar6 = "curl_mime_data() failed\n";
      goto LAB_0010142a;
    }
    iVar1 = curl_mime_encoder(lVar3,"base64");
    if (iVar1 != 0) {
      pcVar6 = "curl_mime_encoder() failed\n";
      goto LAB_0010142a;
    }
    iVar1 = 0;
    lVar3 = curl_slist_append(0,"someone@example.com");
    if (lVar3 != 0) {
      iVar1 = curl_easy_setopt(lVar7,0x2712,URL);
      if ((((iVar1 == 0) &&
           (iVar1 = curl_easy_setopt(lVar7,0x27ca,"somebody@example.com"), iVar1 == 0)) &&
          (iVar1 = curl_easy_setopt(lVar7,0x27cb,lVar3), iVar1 == 0)) &&
         ((iVar1 = curl_easy_setopt(lVar7,0x281d,lVar2), iVar1 == 0 &&
          (iVar1 = curl_easy_setopt(lVar7,0x29,1), iVar1 == 0)))) {
        iVar1 = curl_easy_perform(lVar7);
      }
      goto LAB_00101434;
    }
    curl_mfprintf(_stderr,"curl_slist_append() failed\n");
  }
  lVar3 = 0;
LAB_00101434:
  curl_easy_cleanup(lVar7);
  curl_mime_free(lVar2);
  curl_slist_free_all(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curl = NULL;
  CURLcode res = CURLE_OK;
  curl_mime *mime = NULL;
  curl_mimepart *part;
  struct curl_slist *recipients = NULL;

  /* create a buffer with AAAA...BBBBB...CCCC...etc */
  int i;
  int size = (int)sizeof(buffer) / 10;

  for(i = 0; i < size ; i++)
    memset(&buffer[i * 10], 65 + (i % 26), 10);

  if(curl_global_init(CURL_GLOBAL_ALL) != CURLE_OK) {
    fprintf(stderr, "curl_global_init() failed\n");
    return TEST_ERR_MAJOR_BAD;
  }

  curl = curl_easy_init();
  if(!curl) {
    fprintf(stderr, "curl_easy_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }

  /* Build mime structure. */
  mime = curl_mime_init(curl);
  if(!mime) {
    fprintf(stderr, "curl_mime_init() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  part = curl_mime_addpart(mime);
  if(!part) {
    fprintf(stderr, "curl_mime_addpart() failed\n");
    res = (CURLcode) TEST_ERR_MAJOR_BAD;
    goto test_cleanup;
  }
  res = curl_mime_filename(part, "myfile.jpg");
  if(res) {
    fprintf(stderr, "curl_mime_filename() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_type(part, "image/jpeg");
  if(res) {
    fprintf(stderr, "curl_mime_type() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_data(part, buffer, sizeof(buffer));
  if(res) {
    fprintf(stderr, "curl_mime_data() failed\n");
    goto test_cleanup;
  }
  res = curl_mime_encoder(part, "base64");
  if(res) {
    fprintf(stderr, "curl_mime_encoder() failed\n");
    goto test_cleanup;
  }

  /* Prepare recipients. */
  recipients = curl_slist_append(NULL, "someone@example.com");
  if(!recipients) {
    fprintf(stderr, "curl_slist_append() failed\n");
    goto test_cleanup;
  }

  /* First set the URL that is about to receive our mime mail. */
  test_setopt(curl, CURLOPT_URL, URL);

  /* Set sender. */
  test_setopt(curl, CURLOPT_MAIL_FROM, "somebody@example.com");

  /* Set recipients. */
  test_setopt(curl, CURLOPT_MAIL_RCPT, recipients);

  /* send a multi-part mail */
  test_setopt(curl, CURLOPT_MIMEPOST, mime);

  /* get verbose debug output please */
  test_setopt(curl, CURLOPT_VERBOSE, 1L);

  /* Perform the request, res will get the return code */
  res = curl_easy_perform(curl);

test_cleanup:

  /* always cleanup */
  curl_easy_cleanup(curl);

  /* now cleanup the mime structure */
  curl_mime_free(mime);

  /* cleanup the recipients. */
  curl_slist_free_all(recipients);

  curl_global_cleanup();

  return res;
}